

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O1

void __thiscall
imrt::ACS::ACS(ACS *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_40,w);
  std::vector<double,_std::allocator<double>_>::vector(&local_58,Zmin);
  std::vector<double,_std::allocator<double>_>::vector(&local_70,Zmax);
  ACO::ACO(&this->super_ACO,&local_40,&local_58,&local_70,_collimator,volumes,max_apertures,
           max_intensity,initial_intensity,step_intensity,_n_ants,_initial_pheromone,_alpha,_beta,
           _rho);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (this->super_ACO)._vptr_ACO = (_func_int **)&PTR__ACO_0013cb28;
  this->q0 = 0.5;
  calculateProbability(this);
  return;
}

Assistant:

ACS::ACS(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
           vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
           int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, double _rho):
           ACO(w, Zmin, Zmax, _collimator, volumes, max_apertures, max_intensity, initial_intensity,
               step_intensity, _n_ants, _initial_pheromone, _alpha, _beta, _rho){
             q0=0.5;
             calculateProbability();
             //printProbability();
           }